

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

int __thiscall adios2sys::CommandLineArguments::Parse(CommandLineArguments *this)

{
  bool bVar1;
  int iVar2;
  key_type *pkVar3;
  reference pvVar4;
  size_type sVar5;
  ulong uVar6;
  mapped_type *cs_00;
  long lVar7;
  long lVar8;
  char *pcVar9;
  undefined1 *puVar10;
  key_type *pkVar11;
  undefined8 uVar12;
  ostream *poVar13;
  long *in_RDI;
  string *marg;
  string *sarg;
  CommandLineArgumentsCallbackStructure *cs;
  size_type maxlen;
  size_type maxidx;
  size_type kk;
  string *arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  size_type cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffea0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea8;
  CommandLineArguments *in_stack_fffffffffffffeb0;
  key_type *in_stack_fffffffffffffeb8;
  mapped_type *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffed8;
  CommandLineArgumentsCallbackStructure *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  ulong local_60;
  size_type local_58;
  ulong local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  key_type *local_18;
  int local_4;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xf4060c);
  if ((*(byte *)((long)in_RDI + 0x2c) & 1) != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xf40631);
  }
  local_18 = (key_type *)0x0;
  do {
    pkVar11 = local_18;
    pkVar3 = (key_type *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)*in_RDI);
    if (pkVar3 <= pkVar11) {
      local_4 = 1;
LAB_00f40f1a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffe90);
      return local_4;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)*in_RDI,(size_type)local_18);
    *(key_type **)(*in_RDI + 0x78) = local_18;
    bVar1 = GetMatchedArguments(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                in_stack_fffffffffffffea0);
    if (bVar1) {
      local_58 = 0;
      local_60 = 0;
      for (local_50 = 0;
          sVar5 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&local_30), local_50 < sVar5; local_50 = local_50 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_30,local_50);
        uVar6 = std::__cxx11::string::size();
        if (local_60 < uVar6) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_30,local_50);
          local_60 = std::__cxx11::string::size();
          local_58 = local_50;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,local_58);
      cs_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
                            *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,local_58);
      bVar1 = std::operator!=(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      pkVar11 = local_18;
      if (bVar1) {
        abort();
      }
      switch(cs_00->ArgumentType) {
      case 0:
        bVar1 = PopulateVariable((CommandLineArguments *)
                                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (!bVar1) {
          local_4 = 0;
          goto LAB_00f40f1a;
        }
        break;
      case 1:
        in_stack_fffffffffffffed8 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::size();
        in_stack_fffffffffffffeef =
             PopulateVariable((CommandLineArguments *)
                              CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),cs_00,
                              in_stack_fffffffffffffed8);
        in_stack_fffffffffffffee0 = cs_00;
        if (!(bool)in_stack_fffffffffffffeef) {
          local_4 = 0;
          goto LAB_00f40f1a;
        }
        break;
      case 2:
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)*in_RDI);
        if (pkVar11 == (key_type *)(sVar5 - 1)) {
          *(long *)(*in_RDI + 0x78) = *(long *)(*in_RDI + 0x78) + -1;
          local_4 = 0;
          goto LAB_00f40f1a;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)*in_RDI,(size_type)&local_18->field_0x1);
        std::__cxx11::string::c_str();
        bVar1 = PopulateVariable((CommandLineArguments *)
                                 CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (!bVar1) {
          local_4 = 0;
          goto LAB_00f40f1a;
        }
        local_18 = (key_type *)&local_18->field_0x1;
        break;
      case 3:
        lVar7 = std::__cxx11::string::size();
        lVar8 = std::__cxx11::string::size();
        if (lVar7 != lVar8) {
          std::__cxx11::string::size();
          pcVar9 = (char *)std::__cxx11::string::at((ulong)pvVar4);
          if (*pcVar9 == '=') {
            std::__cxx11::string::c_str();
            std::__cxx11::string::size();
            bVar1 = PopulateVariable((CommandLineArguments *)
                                     CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
            if (bVar1) break;
            local_4 = 0;
            goto LAB_00f40f1a;
          }
        }
        *(long *)(*in_RDI + 0x78) = *(long *)(*in_RDI + 0x78) + -1;
        local_4 = 0;
        goto LAB_00f40f1a;
      case 4:
        while( true ) {
          local_18 = (key_type *)&local_18->field_0x1;
          pkVar11 = local_18;
          puVar10 = (undefined1 *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)*in_RDI);
          if (puVar10 <= pkVar11) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)*in_RDI,(size_type)local_18);
          bVar1 = GetMatchedArguments(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                      in_stack_fffffffffffffea0);
          if (bVar1) break;
          in_stack_fffffffffffffec0 = cs_00;
          std::__cxx11::string::c_str();
          bVar1 = PopulateVariable((CommandLineArguments *)
                                   CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                                   in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          if (!bVar1) {
            local_4 = 0;
            goto LAB_00f40f1a;
          }
        }
        in_stack_fffffffffffffeb8 = local_18;
        pkVar11 = (key_type *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)*in_RDI);
        if (in_stack_fffffffffffffeb8 != pkVar11) {
          local_18 = (key_type *)(local_18[-1].field_2._M_local_buf + 0xf);
        }
        break;
      default:
        poVar13 = std::operator<<((ostream *)&std::cerr,"Got unknown argument type: \"");
        poVar13 = (ostream *)std::ostream::operator<<(poVar13,cs_00->ArgumentType);
        poVar13 = std::operator<<(poVar13,"\"");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        *(long *)(*in_RDI + 0x78) = *(long *)(*in_RDI + 0x78) + -1;
        local_4 = 0;
        goto LAB_00f40f1a;
      }
    }
    else {
      if (*(long *)(*in_RDI + 0x68) != 0) {
        in_stack_fffffffffffffe90 =
             *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)(*in_RDI + 0x68);
        uVar12 = std::__cxx11::string::c_str();
        iVar2 = (*(code *)in_stack_fffffffffffffe90)(uVar12,*(undefined8 *)(*in_RDI + 0x70));
        if (iVar2 == 0) {
          *(long *)(*in_RDI + 0x78) = *(long *)(*in_RDI + 0x78) + -1;
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
        goto LAB_00f40f1a;
      }
      if ((*(byte *)((long)in_RDI + 0x2c) & 1) == 0) {
        poVar13 = std::operator<<((ostream *)&std::cerr,"Got unknown argument: \"");
        poVar13 = std::operator<<(poVar13,(string *)pvVar4);
        poVar13 = std::operator<<(poVar13,"\"");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        *(long *)(*in_RDI + 0x78) = *(long *)(*in_RDI + 0x78) + -1;
        local_4 = 0;
        goto LAB_00f40f1a;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    local_18 = (key_type *)&local_18->field_0x1;
  } while( true );
}

Assistant:

int CommandLineArguments::Parse()
{
  std::vector<std::string>::size_type cc;
  std::vector<std::string> matches;
  if (this->StoreUnusedArgumentsFlag) {
    this->Internals->UnusedArguments.clear();
  }
  for (cc = 0; cc < this->Internals->Argv.size(); cc++) {
    const std::string& arg = this->Internals->Argv[cc];
    CommandLineArguments_DEBUG("Process argument: " << arg);
    this->Internals->LastArgument = cc;
    if (this->GetMatchedArguments(&matches, arg)) {
      // Ok, we found one or more arguments that match what user specified.
      // Let's find the longest one.
      CommandLineArguments::Internal::VectorOfStrings::size_type kk;
      CommandLineArguments::Internal::VectorOfStrings::size_type maxidx = 0;
      CommandLineArguments::Internal::String::size_type maxlen = 0;
      for (kk = 0; kk < matches.size(); kk++) {
        if (matches[kk].size() > maxlen) {
          maxlen = matches[kk].size();
          maxidx = kk;
        }
      }
      // So, the longest one is probably the right one. Now see if it has any
      // additional value
      CommandLineArgumentsCallbackStructure* cs =
        &this->Internals->Callbacks[matches[maxidx]];
      const std::string& sarg = matches[maxidx];
      if (cs->Argument != sarg) {
        abort();
      }
      switch (cs->ArgumentType) {
        case NO_ARGUMENT:
          // No value
          if (!this->PopulateVariable(cs, nullptr)) {
            return 0;
          }
          break;
        case SPACE_ARGUMENT:
          if (cc == this->Internals->Argv.size() - 1) {
            this->Internals->LastArgument--;
            return 0;
          }
          CommandLineArguments_DEBUG("This is a space argument: "
                                     << arg << " value: "
                                     << this->Internals->Argv[cc + 1]);
          // Value is the next argument
          if (!this->PopulateVariable(cs,
                                      this->Internals->Argv[cc + 1].c_str())) {
            return 0;
          }
          cc++;
          break;
        case EQUAL_ARGUMENT:
          if (arg.size() == sarg.size() || arg.at(sarg.size()) != '=') {
            this->Internals->LastArgument--;
            return 0;
          }
          // Value is everythng followed the '=' sign
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size() + 1)) {
            return 0;
          }
          break;
        case CONCAT_ARGUMENT:
          // Value is whatever follows the argument
          if (!this->PopulateVariable(cs, arg.c_str() + sarg.size())) {
            return 0;
          }
          break;
        case MULTI_ARGUMENT:
          // Suck in all the rest of the arguments
          CommandLineArguments_DEBUG("This is a multi argument: " << arg);
          for (cc++; cc < this->Internals->Argv.size(); ++cc) {
            const std::string& marg = this->Internals->Argv[cc];
            CommandLineArguments_DEBUG(
              " check multi argument value: " << marg);
            if (this->GetMatchedArguments(&matches, marg)) {
              CommandLineArguments_DEBUG("End of multi argument "
                                         << arg << " with value: " << marg);
              break;
            }
            CommandLineArguments_DEBUG(
              " populate multi argument value: " << marg);
            if (!this->PopulateVariable(cs, marg.c_str())) {
              return 0;
            }
          }
          if (cc != this->Internals->Argv.size()) {
            CommandLineArguments_DEBUG("Again End of multi argument " << arg);
            cc--;
            continue;
          }
          break;
        default:
          std::cerr << "Got unknown argument type: \"" << cs->ArgumentType
                    << "\"" << std::endl;
          this->Internals->LastArgument--;
          return 0;
      }
    } else {
      // Handle unknown arguments
      if (this->Internals->UnknownArgumentCallback) {
        if (!this->Internals->UnknownArgumentCallback(
              arg.c_str(), this->Internals->ClientData)) {
          this->Internals->LastArgument--;
          return 0;
        }
        return 1;
      } else if (this->StoreUnusedArgumentsFlag) {
        CommandLineArguments_DEBUG("Store unused argument " << arg);
        this->Internals->UnusedArguments.push_back(arg);
      } else {
        std::cerr << "Got unknown argument: \"" << arg << "\"" << std::endl;
        this->Internals->LastArgument--;
        return 0;
      }
    }
  }
  return 1;
}